

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  Status *pSVar2;
  bool bVar3;
  int iVar4;
  Status SVar5;
  Verbosity VVar6;
  Representation RVar7;
  Type TVar8;
  int iVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  int *piVar11;
  char *pcVar12;
  DataKey *pDVar13;
  SPxId *pSVar14;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_1;
  int i_9;
  int i_8;
  DIdxSet basiccandidates_1;
  int i_7;
  int i_6;
  DIdxSet basiccandidates;
  int ncols_1;
  bool useIntegrality;
  int i_5;
  int i_4;
  DIdxSet candidates;
  int i_3;
  int i_2;
  undefined1 in_stack_0000057f;
  int i_1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000588;
  int i;
  DIdxSet continuousvars;
  DIdxSet slackcandidates;
  int ncols;
  int nrows;
  undefined1 in_stack_000006a3;
  int in_stack_000006a4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000006a8;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  alloweddeviation;
  bool success;
  SPxId polishId;
  Status stat;
  Status *colstatus;
  Status *rowstatus;
  Desc *ds;
  int nSuccessfulPivots;
  bool stop;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  undefined6 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f6;
  undefined1 in_stack_fffffffffffff6f7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6f8;
  SPxStatus stat_00;
  undefined4 in_stack_fffffffffffff700;
  undefined2 in_stack_fffffffffffff704;
  byte in_stack_fffffffffffff706;
  undefined1 in_stack_fffffffffffff707;
  undefined4 in_stack_fffffffffffff708;
  int in_stack_fffffffffffff70c;
  DIdxSet *in_stack_fffffffffffff710;
  DataArray<int> *this_00;
  byte local_8ce;
  undefined1 in_stack_fffffffffffff757;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff758;
  byte local_86a;
  byte local_855;
  byte local_833;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7d0;
  DataKey in_stack_fffffffffffff7d8;
  undefined5 in_stack_fffffffffffff7e0;
  byte in_stack_fffffffffffff7e5;
  undefined1 in_stack_fffffffffffff7e6;
  undefined1 in_stack_fffffffffffff7e7;
  byte local_7ed;
  undefined1 local_7ec [56];
  undefined1 local_7b4 [56];
  undefined1 local_77c [56];
  undefined4 local_744;
  Verbosity local_740;
  uint local_73c;
  undefined4 local_700;
  undefined1 local_6fc [56];
  undefined1 local_6c4 [56];
  SPxColId local_68c;
  int local_684;
  IdxSet local_680;
  uint local_65c;
  undefined4 local_620;
  undefined1 local_61c [56];
  undefined1 local_5e4 [56];
  SPxColId local_5ac;
  int local_5a4;
  IdxSet local_5a0;
  int local_57c;
  byte local_575;
  undefined1 local_574 [56];
  DataKey local_53c;
  uint local_534;
  undefined4 local_4f8;
  undefined1 local_4f4 [56];
  undefined1 local_4bc [56];
  int local_484;
  IdxSet local_480;
  DataKey local_45c;
  uint local_454;
  DataKey local_450;
  uint local_448;
  undefined4 local_40c;
  undefined1 local_408 [56];
  undefined1 local_3d0 [56];
  int local_398;
  undefined4 local_35c;
  undefined1 local_358 [56];
  undefined1 local_320 [56];
  int local_2e8;
  IdxSet local_2d8;
  IdxSet local_2b8;
  int local_294;
  int local_290;
  undefined1 local_28c [56];
  undefined4 local_254;
  Verbosity local_250;
  undefined1 local_24c [56];
  undefined1 local_214 [59];
  byte local_1d9;
  DataKey local_1d8;
  Status local_1cc;
  Status *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  int local_1b0;
  byte local_1a9;
  bool local_199;
  undefined8 local_198;
  undefined4 *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined4 *local_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined4 *local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined4 *local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined4 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_7ed = 0;
  if (-1 < in_RDI->maxIters) {
    iVar4 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x32e22e);
    local_7ed = 0;
    if (in_RDI->maxIters <= iVar4) {
      bVar3 = isTimeLimitReached(in_stack_fffffffffffff758,(bool)in_stack_fffffffffffff757);
      local_7ed = bVar3 ^ 0xff;
    }
  }
  local_1a9 = local_7ed & 1;
  if (((local_1a9 == 0) && (in_RDI->polishObj != POLISH_OFF)) &&
     (SVar5 = status(in_stack_fffffffffffff6f8), SVar5 == OPTIMAL)) {
    local_1b8 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::desc(&in_RDI->
                           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         );
    local_1c0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::Desc::rowStatus((Desc *)0x32e2d4);
    local_1c8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::colStatus((Desc *)0x32e2e9);
    SPxId::SPxId((SPxId *)0x32e2fe);
    local_1d9 = 0;
    local_120 = local_214;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff6f7,
                        CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_24c);
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar6)) {
      local_250 = SPxOut::getVerbosity(in_RDI->spxout);
      local_254 = 4;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_254);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (char *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_250);
    }
    RVar7 = rep(in_RDI);
    TVar8 = (Type)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
    if (RVar7 == COLUMN) {
      setType((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffff707,
                          CONCAT16(in_stack_fffffffffffff706,
                                   CONCAT24(in_stack_fffffffffffff704,in_stack_fffffffffffff700))),
              TVar8);
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])();
      entertol((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
      local_b0 = local_214;
      local_b8 = local_28c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff6f7,
                          CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      in_RDI->instableEnter = false;
      pSVar1 = in_RDI->theratiotester;
      TVar8 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar8);
      local_290 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x32e4c6);
      local_294 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x32e4da);
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
        DIdxSet::DIdxSet(in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
        for (local_2e8 = 0; local_2e8 < local_290; local_2e8 = local_2e8 + 1) {
          if (((local_1c0->m_backend).data._M_elems[local_2e8] == 0xfffffffc) ||
             ((local_1c0->m_backend).data._M_elems[local_2e8] == 0xfffffffe)) {
            local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffff6f7,
                                                 CONCAT16(in_stack_fffffffffffff6f6,
                                                          in_stack_fffffffffffff6f0)),
                                     in_stack_fffffffffffff6ec);
            local_110 = local_320;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff6f7,
                                CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
            local_35c = 0;
            local_188 = local_358;
            local_190 = &local_35c;
            local_198 = 0;
            local_88 = local_190;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff707,
                                CONCAT16(in_stack_fffffffffffff706,
                                         CONCAT24(in_stack_fffffffffffff704,
                                                  in_stack_fffffffffffff700))),
                       (longlong)in_stack_fffffffffffff6f8,
                       (type *)CONCAT17(in_stack_fffffffffffff6f7,
                                        CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0
                                                )));
            epsilon(in_stack_fffffffffffff6f8);
            bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_fffffffffffff7e7,
                                           CONCAT16(in_stack_fffffffffffff7e6,
                                                    CONCAT15(in_stack_fffffffffffff7e5,
                                                             in_stack_fffffffffffff7e0))),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
            if (bVar3) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffff6f7,
                                       CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)
                                      ),in_stack_fffffffffffff6ec);
            }
          }
        }
        iVar4 = DataArray<int>::size(&in_RDI->integerVariables);
        if (iVar4 == local_294) {
          for (local_398 = 0; local_398 < local_294; local_398 = local_398 + 1) {
            if ((local_1c8[local_398] == P_ON_LOWER) || (local_1c8[local_398] == P_ON_UPPER)) {
              pnVar10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT17(in_stack_fffffffffffff6f7,
                                             CONCAT16(in_stack_fffffffffffff6f6,
                                                      in_stack_fffffffffffff6f0)),
                                 in_stack_fffffffffffff6ec);
              local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT17(in_stack_fffffffffffff6f7,
                                                  CONCAT16(in_stack_fffffffffffff6f6,
                                                           in_stack_fffffffffffff6f0)),
                                      in_stack_fffffffffffff6ec);
              local_30 = pnVar10;
              local_28 = local_3d0;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_39,pnVar10,local_38);
              local_20 = local_3d0;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
              local_10 = local_30;
              local_18 = local_38;
              local_8 = local_3d0;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                         (cpp_dec_float<50U,_int,_void> *)0x32e83c);
              local_40c = 0;
              local_170 = local_408;
              local_178 = &local_40c;
              local_180 = 0;
              local_90 = local_178;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff707,
                                  CONCAT16(in_stack_fffffffffffff706,
                                           CONCAT24(in_stack_fffffffffffff704,
                                                    in_stack_fffffffffffff700))),
                         (longlong)in_stack_fffffffffffff6f8,
                         (type *)CONCAT17(in_stack_fffffffffffff6f7,
                                          CONCAT16(in_stack_fffffffffffff6f6,
                                                   in_stack_fffffffffffff6f0)));
              epsilon(in_stack_fffffffffffff6f8);
              in_stack_fffffffffffff7e7 =
                   EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT17(in_stack_fffffffffffff7e7,
                                          CONCAT16(in_stack_fffffffffffff7e6,
                                                   CONCAT15(in_stack_fffffffffffff7e5,
                                                            in_stack_fffffffffffff7e0))),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
              in_stack_fffffffffffff7e6 = false;
              if ((bool)in_stack_fffffffffffff7e7) {
                piVar11 = DataArray<int>::operator[](&in_RDI->integerVariables,local_398);
                in_stack_fffffffffffff7e6 = *piVar11 == 0;
              }
              if ((bool)in_stack_fffffffffffff7e6 != false) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff6f7,
                                         CONCAT16(in_stack_fffffffffffff6f6,
                                                  in_stack_fffffffffffff6f0)),
                                in_stack_fffffffffffff6ec);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_448 = IdxSet::size(&local_2b8);
          uVar15 = extraout_RDX;
          while( true ) {
            local_448 = local_448 - 1;
            in_stack_fffffffffffff7e5 = 0;
            if (-1 < (int)local_448) {
              in_stack_fffffffffffff7e5 = local_1a9 ^ 0xff;
            }
            if ((in_stack_fffffffffffff7e5 & 1) == 0) break;
            IdxSet::index(&local_2b8,(char *)(ulong)local_448,(int)uVar15);
            in_stack_fffffffffffff7d8 =
                 (DataKey)coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                               CONCAT13(in_stack_fffffffffffff707,
                                        CONCAT12(in_stack_fffffffffffff706,in_stack_fffffffffffff704
                                                )));
            in_stack_fffffffffffff7d0 = local_1c0;
            local_450 = in_stack_fffffffffffff7d8;
            local_1d8 = in_stack_fffffffffffff7d8;
            pcVar12 = IdxSet::index(&local_2b8,(char *)(ulong)local_448,__c);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       (Status *)
                       ((in_stack_fffffffffffff7d0->m_backend).data._M_elems + (int)pcVar12));
            local_1d9 = enter(in_stack_00000588,_i_1,(bool)in_stack_0000057f);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_2b8,(char *)(ulong)local_448);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x32eb19), in_RDI->maxIters <= iVar4)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff758,(bool)in_stack_fffffffffffff757);
            uVar15 = extraout_RDX_00;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          local_454 = IdxSet::size(&local_2d8);
          uVar15 = extraout_RDX_01;
          while( true ) {
            local_454 = local_454 - 1;
            local_833 = 0;
            if (-1 < (int)local_454) {
              local_833 = local_1a9 ^ 0xff;
            }
            if ((local_833 & 1) == 0) break;
            IdxSet::index(&local_2d8,(char *)(ulong)local_454,(int)uVar15);
            local_45c = (DataKey)id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708)
                                    ,CONCAT13(in_stack_fffffffffffff707,
                                              CONCAT12(in_stack_fffffffffffff706,
                                                       in_stack_fffffffffffff704)));
            pSVar2 = local_1c8;
            local_1d8 = local_45c;
            pcVar12 = IdxSet::index(&local_2d8,(char *)(ulong)local_454,__c_00);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar12);
            local_1d9 = enter(in_stack_00000588,_i_1,(bool)in_stack_0000057f);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_2d8,(char *)(ulong)local_454);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x32ed24), in_RDI->maxIters <= iVar4)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff758,(bool)in_stack_fffffffffffff757);
            uVar15 = extraout_RDX_02;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff6f7,
                                   CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff6f7,
                                   CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
      }
      else {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x32ee09);
        DIdxSet::DIdxSet(in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
        local_484 = 0;
        while( true ) {
          iVar4 = local_484;
          iVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x32ee3e);
          local_855 = 0;
          if (iVar4 < iVar9) {
            local_855 = local_1a9 ^ 0xff;
          }
          if ((local_855 & 1) == 0) break;
          if ((local_1c8[local_484] == P_ON_LOWER) || (local_1c8[local_484] == P_ON_UPPER)) {
            pnVar10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff6f7,
                                           CONCAT16(in_stack_fffffffffffff6f6,
                                                    in_stack_fffffffffffff6f0)),
                               in_stack_fffffffffffff6ec);
            local_78 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT17(in_stack_fffffffffffff6f7,
                                                CONCAT16(in_stack_fffffffffffff6f6,
                                                         in_stack_fffffffffffff6f0)),
                                    in_stack_fffffffffffff6ec);
            local_70 = pnVar10;
            local_68 = local_4bc;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_79,pnVar10,local_78);
            local_60 = local_4bc;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff6f7,
                                CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
            local_50 = local_70;
            local_58 = local_78;
            local_48 = local_4bc;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff6f7,
                                CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                       (cpp_dec_float<50U,_int,_void> *)0x32efa3);
            local_4f8 = 0;
            local_158 = local_4f4;
            local_160 = &local_4f8;
            local_168 = 0;
            local_98 = local_160;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff707,
                                CONCAT16(in_stack_fffffffffffff706,
                                         CONCAT24(in_stack_fffffffffffff704,
                                                  in_stack_fffffffffffff700))),
                       (longlong)in_stack_fffffffffffff6f8,
                       (type *)CONCAT17(in_stack_fffffffffffff6f7,
                                        CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0
                                                )));
            epsilon(in_stack_fffffffffffff6f8);
            bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_fffffffffffff7e7,
                                           CONCAT16(in_stack_fffffffffffff7e6,
                                                    CONCAT15(in_stack_fffffffffffff7e5,
                                                             in_stack_fffffffffffff7e0))),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
            if (bVar3) {
              DIdxSet::addIdx((DIdxSet *)
                              CONCAT17(in_stack_fffffffffffff6f7,
                                       CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)
                                      ),in_stack_fffffffffffff6ec);
            }
          }
          local_484 = local_484 + 1;
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_534 = IdxSet::size(&local_480);
          uVar15 = extraout_RDX_03;
          while( true ) {
            local_534 = local_534 - 1;
            local_86a = 0;
            if (-1 < (int)local_534) {
              local_86a = local_1a9 ^ 0xff;
            }
            if ((local_86a & 1) == 0) break;
            IdxSet::index(&local_480,(char *)(ulong)local_534,(int)uVar15);
            local_53c = (DataKey)id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708)
                                    ,CONCAT13(in_stack_fffffffffffff707,
                                              CONCAT12(in_stack_fffffffffffff706,
                                                       in_stack_fffffffffffff704)));
            pSVar2 = local_1c8;
            local_1d8 = local_53c;
            pcVar12 = IdxSet::index(&local_480,(char *)(ulong)local_534,__c_01);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_soplex::SPxId_&,_const_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
                      (in_RDI,(char (*) [27])"try pivoting: {} stat: {}\n",(SPxId *)&local_1d8,
                       pSVar2 + (int)pcVar12);
            local_1d9 = enter(in_stack_00000588,_i_1,(bool)in_stack_0000057f);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_480,(char *)(ulong)local_534);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x32f265), in_RDI->maxIters <= iVar4)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff758,(bool)in_stack_fffffffffffff757);
            uVar15 = extraout_RDX_04;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff6f7,
                                   CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
      }
    }
    else {
      setType((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffff707,
                          CONCAT16(in_stack_fffffffffffff706,
                                   CONCAT24(in_stack_fffffffffffff704,in_stack_fffffffffffff700))),
              TVar8);
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])();
      leavetol((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
      local_c0 = local_214;
      local_c8 = local_574;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff6f7,
                          CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      in_RDI->instableLeave = false;
      pSVar1 = in_RDI->theratiotester;
      TVar8 = type(in_RDI);
      (*pSVar1->_vptr_SPxRatioTester[9])(pSVar1,(ulong)(uint)TVar8);
      local_575 = 0;
      local_57c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x32f3d3);
      iVar4 = DataArray<int>::size(&in_RDI->integerVariables);
      if (iVar4 == local_57c) {
        local_575 = 1;
      }
      if (in_RDI->polishObj == POLISH_INTEGRALITY) {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x32f421);
        DIdxSet::DIdxSet(in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
        for (local_5a4 = 0; iVar4 = local_5a4,
            iVar9 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x32f456), iVar4 < iVar9; local_5a4 = local_5a4 + 1) {
          pDVar13 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffff6f7,
                                          CONCAT16(in_stack_fffffffffffff6f6,
                                                   in_stack_fffffffffffff6f0)),
                              in_stack_fffffffffffff6ec)->super_DataKey;
          local_1d8 = *pDVar13;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_1d8);
          if (bVar3) {
            in_stack_fffffffffffff758 = local_1b8;
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_fffffffffffff707,
                                 CONCAT16(in_stack_fffffffffffff706,
                                          CONCAT24(in_stack_fffffffffffff704,
                                                   in_stack_fffffffffffff700))),
                     (SPxId *)in_stack_fffffffffffff6f8);
            local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::Desc::rowStatus((Desc *)CONCAT17(in_stack_fffffffffffff6f7,
                                                           CONCAT16(in_stack_fffffffffffff6f6,
                                                                    in_stack_fffffffffffff6f0)),
                                          in_stack_fffffffffffff6ec);
LAB_0032f5d9:
            if ((local_1cc == P_ON_LOWER) || (local_1cc == P_ON_UPPER)) {
              local_108 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT17(in_stack_fffffffffffff6f7,
                                                   CONCAT16(in_stack_fffffffffffff6f6,
                                                            in_stack_fffffffffffff6f0)),
                                       in_stack_fffffffffffff6ec);
              local_100 = local_5e4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              local_620 = 0;
              local_140 = local_61c;
              local_148 = &local_620;
              local_150 = 0;
              local_a0 = local_148;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff707,
                                  CONCAT16(in_stack_fffffffffffff706,
                                           CONCAT24(in_stack_fffffffffffff704,
                                                    in_stack_fffffffffffff700))),
                         (longlong)in_stack_fffffffffffff6f8,
                         (type *)CONCAT17(in_stack_fffffffffffff6f7,
                                          CONCAT16(in_stack_fffffffffffff6f6,
                                                   in_stack_fffffffffffff6f0)));
              epsilon(in_stack_fffffffffffff6f8);
              bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT17(in_stack_fffffffffffff7e7,
                                             CONCAT16(in_stack_fffffffffffff7e6,
                                                      CONCAT15(in_stack_fffffffffffff7e5,
                                                               in_stack_fffffffffffff7e0))),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
              if (bVar3) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff6f7,
                                         CONCAT16(in_stack_fffffffffffff6f6,
                                                  in_stack_fffffffffffff6f0)),
                                in_stack_fffffffffffff6ec);
              }
            }
          }
          else {
            in_stack_fffffffffffff757 = true;
            if ((local_575 & 1) != 0) {
              SPxColId::SPxColId(&local_5ac,(SPxId *)&local_1d8);
              iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff6f7,
                                           CONCAT16(in_stack_fffffffffffff6f6,
                                                    in_stack_fffffffffffff6f0)),
                               (SPxColId *)
                               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              piVar11 = DataArray<int>::operator[](&in_RDI->integerVariables,iVar4);
              in_stack_fffffffffffff757 = *piVar11 == 1;
            }
            if ((bool)in_stack_fffffffffffff757 == false) {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffff707,
                                   CONCAT16(in_stack_fffffffffffff706,
                                            CONCAT24(in_stack_fffffffffffff704,
                                                     in_stack_fffffffffffff700))),
                       (SPxId *)in_stack_fffffffffffff6f8);
              local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::Desc::colStatus((Desc *)CONCAT17(in_stack_fffffffffffff6f7,
                                                             CONCAT16(in_stack_fffffffffffff6f6,
                                                                      in_stack_fffffffffffff6f0)),
                                            in_stack_fffffffffffff6ec);
              goto LAB_0032f5d9;
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_65c = IdxSet::size(&local_5a0);
          uVar15 = extraout_RDX_05;
          while( true ) {
            local_65c = local_65c - 1;
            local_8ce = 0;
            if (-1 < (int)local_65c) {
              local_8ce = local_1a9 ^ 0xff;
            }
            if ((local_8ce & 1) == 0) break;
            IdxSet::index(&local_5a0,(char *)(ulong)local_65c,(int)uVar15);
            pSVar14 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff6f7,
                                           CONCAT16(in_stack_fffffffffffff6f6,
                                                    in_stack_fffffffffffff6f0)),
                               in_stack_fffffffffffff6ec);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",pSVar14);
            IdxSet::index(&local_5a0,(char *)(ulong)local_65c,__c_02);
            local_1d9 = leave(in_stack_000006a8,in_stack_000006a4,(bool)in_stack_000006a3);
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_5a0,(char *)(ulong)local_65c);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x32f876), in_RDI->maxIters <= iVar4)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            bVar3 = isTimeLimitReached(in_stack_fffffffffffff758,(bool)in_stack_fffffffffffff757);
            uVar15 = extraout_RDX_06;
            if (bVar3) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff6f7,
                                   CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
      }
      else {
        dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x32f936);
        DIdxSet::DIdxSet(in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
        for (local_684 = 0; iVar4 = local_684,
            iVar9 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x32f968), iVar4 < iVar9; local_684 = local_684 + 1) {
          pDVar13 = &SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffff6f7,
                                          CONCAT16(in_stack_fffffffffffff6f6,
                                                   in_stack_fffffffffffff6f0)),
                              in_stack_fffffffffffff6ec)->super_DataKey;
          local_1d8 = *pDVar13;
          bVar3 = SPxId::isSPxRowId((SPxId *)&local_1d8);
          if (!bVar3) {
            bVar3 = false;
            if ((local_575 & 1) != 0) {
              this_00 = &in_RDI->integerVariables;
              SPxColId::SPxColId(&local_68c,(SPxId *)&local_1d8);
              iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff6f7,
                                           CONCAT16(in_stack_fffffffffffff6f6,
                                                    in_stack_fffffffffffff6f0)),
                               (SPxColId *)
                               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              piVar11 = DataArray<int>::operator[](this_00,iVar4);
              bVar3 = *piVar11 == 0;
            }
            if ((!bVar3) &&
               ((local_1cc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::Desc::colStatus((Desc *)CONCAT17(in_stack_fffffffffffff6f7,
                                                                CONCAT16(in_stack_fffffffffffff6f6,
                                                                         in_stack_fffffffffffff6f0))
                                               ,in_stack_fffffffffffff6ec), local_1cc == P_ON_LOWER
                || (local_1cc == P_ON_UPPER)))) {
              local_f8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT17(in_stack_fffffffffffff6f7,
                                                  CONCAT16(in_stack_fffffffffffff6f6,
                                                           in_stack_fffffffffffff6f0)),
                                      in_stack_fffffffffffff6ec);
              local_f0 = local_6c4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              local_700 = 0;
              local_128 = local_6fc;
              local_130 = &local_700;
              local_138 = 0;
              local_a8 = local_130;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT17(in_stack_fffffffffffff707,
                                  CONCAT16(in_stack_fffffffffffff706,
                                           CONCAT24(in_stack_fffffffffffff704,
                                                    in_stack_fffffffffffff700))),
                         (longlong)in_stack_fffffffffffff6f8,
                         (type *)CONCAT17(in_stack_fffffffffffff6f7,
                                          CONCAT16(in_stack_fffffffffffff6f6,
                                                   in_stack_fffffffffffff6f0)));
              epsilon(in_stack_fffffffffffff6f8);
              in_stack_fffffffffffff707 =
                   EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT17(in_stack_fffffffffffff7e7,
                                          CONCAT16(in_stack_fffffffffffff7e6,
                                                   CONCAT15(in_stack_fffffffffffff7e5,
                                                            in_stack_fffffffffffff7e0))),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
              if ((bool)in_stack_fffffffffffff707) {
                DIdxSet::addIdx((DIdxSet *)
                                CONCAT17(in_stack_fffffffffffff6f7,
                                         CONCAT16(in_stack_fffffffffffff6f6,
                                                  in_stack_fffffffffffff6f0)),
                                in_stack_fffffffffffff6ec);
              }
            }
          }
        }
        while (stat_00 = (SPxStatus)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
              ((local_1a9 ^ 0xff) & 1) != 0) {
          local_1b0 = 0;
          local_73c = IdxSet::size(&local_680);
          uVar15 = extraout_RDX_07;
          while( true ) {
            local_73c = local_73c - 1;
            in_stack_fffffffffffff706 = 0;
            if (-1 < (int)local_73c) {
              in_stack_fffffffffffff706 = local_1a9 ^ 0xff;
            }
            if ((in_stack_fffffffffffff706 & 1) == 0) break;
            in_stack_fffffffffffff6f8 =
                 (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_RDI->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ;
            IdxSet::index(&local_680,(char *)(ulong)local_73c,(int)uVar15);
            pSVar14 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffff6f7,
                                           CONCAT16(in_stack_fffffffffffff6f6,
                                                    in_stack_fffffffffffff6f0)),
                               in_stack_fffffffffffff6ec);
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[17],_soplex::SPxId_&,_0>
                      (in_RDI,(char (*) [17])"try pivoting: {}",pSVar14);
            IdxSet::index(&local_680,(char *)(ulong)local_73c,__c_03);
            in_stack_fffffffffffff6f7 =
                 leave(in_stack_000006a8,in_stack_000006a4,(bool)in_stack_000006a3);
            local_1d9 = in_stack_fffffffffffff6f7;
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])();
            if ((local_1d9 & 1) != 0) {
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                        (in_RDI,(char (*) [13])" -> success!");
              local_1b0 = local_1b0 + 1;
              IdxSet::remove(&local_680,(char *)(ulong)local_73c);
              if ((-1 < in_RDI->maxIters) &&
                 (iVar4 = iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x32fd20), in_RDI->maxIters <= iVar4)) {
                local_1a9 = 1;
              }
            }
            SPxOut::
            debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[2],_0>
                      (in_RDI,(char (*) [2])0x7e7535);
            in_stack_fffffffffffff6f6 =
                 isTimeLimitReached(in_stack_fffffffffffff758,(bool)in_stack_fffffffffffff757);
            uVar15 = extraout_RDX_08;
            if ((bool)in_stack_fffffffffffff6f6) {
              local_1a9 = 1;
            }
          }
          if (local_1b0 == 0) {
            local_1a9 = 1;
          }
          in_RDI->polishCount = local_1b0 + in_RDI->polishCount;
        }
        DIdxSet::~DIdxSet((DIdxSet *)
                          CONCAT17(in_stack_fffffffffffff6f7,
                                   CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
      }
    }
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 2 < (int)VVar6)) {
      local_740 = SPxOut::getVerbosity(in_RDI->spxout);
      local_744 = 3;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_744);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (char *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         in_stack_fffffffffffff6ec);
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (char *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      soplex::operator<<((SPxOut *)
                         CONCAT17(in_stack_fffffffffffff6f7,
                                  CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_740);
    }
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT17(in_stack_fffffffffffff707,
                            CONCAT16(in_stack_fffffffffffff706,
                                     CONCAT24(in_stack_fffffffffffff704,in_stack_fffffffffffff700)))
                ,stat_00);
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_77c);
    local_e0 = local_7b4;
    local_e8 = local_24c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff6f7,
                        CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    local_d0 = local_7ec;
    local_d8 = local_214;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff6f7,
                        CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(in_stack_fffffffffffff7e7,
                                   CONCAT16(in_stack_fffffffffffff7e6,
                                            CONCAT15(in_stack_fffffffffffff7e5,
                                                     in_stack_fffffffffffff7e0))),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_199 = false;
    }
    else {
      local_199 = true;
    }
  }
  else {
    local_199 = false;
  }
  return local_199;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}